

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tga.c
# Opt level: O1

image_data * tga_read(sptr_t data)

{
  byte *__src;
  byte bVar1;
  uint8_t uVar2;
  uint16_t uVar3;
  uint uVar4;
  byte *pbVar5;
  image_data *piVar6;
  ulong uVar7;
  int iVar8;
  ulong __n;
  byte *__src_00;
  size_t size;
  sptr_t sVar9;
  sptr_t colors;
  uchar *ptr;
  uchar *local_38;
  
  pbVar5 = (byte *)xmalloc(0x14);
  local_38 = data.ptr;
  bVar1 = read_8(&local_38);
  *pbVar5 = bVar1;
  bVar1 = read_8(&local_38);
  pbVar5[1] = bVar1;
  bVar1 = read_8(&local_38);
  pbVar5[2] = bVar1;
  uVar3 = read_le16(&local_38);
  *(uint16_t *)(pbVar5 + 4) = uVar3;
  uVar3 = read_le16(&local_38);
  *(uint16_t *)(pbVar5 + 6) = uVar3;
  bVar1 = read_8(&local_38);
  pbVar5[8] = bVar1;
  uVar3 = read_le16(&local_38);
  *(uint16_t *)(pbVar5 + 10) = uVar3;
  uVar3 = read_le16(&local_38);
  *(uint16_t *)(pbVar5 + 0xc) = uVar3;
  uVar3 = read_le16(&local_38);
  *(uint16_t *)(pbVar5 + 0xe) = uVar3;
  uVar3 = read_le16(&local_38);
  *(uint16_t *)(pbVar5 + 0x10) = uVar3;
  bVar1 = read_8(&local_38);
  pbVar5[0x12] = bVar1;
  bVar1 = read_8(&local_38);
  pbVar5[0x13] = bVar1 << 4 | pbVar5[0x13] & 3 | bVar1 >> 2 & 0xc;
  sVar9 = sptr_advance(data,0x12);
  piVar6 = (image_data *)xmalloc(0x50);
  if (pbVar5[1] == 0) {
    size = 0;
  }
  else {
    size = (size_t)((uint)pbVar5[8] * (uint)*(ushort *)(pbVar5 + 6) >> 3);
  }
  piVar6->header = pbVar5;
  piVar6->type = '\x03';
  piVar6->width = (uint)*(ushort *)(pbVar5 + 0xe);
  piVar6->height = (uint)*(ushort *)(pbVar5 + 0x10);
  (piVar6->palette).data.ptr = (uchar *)0x0;
  (piVar6->palette).data.size = 0;
  (piVar6->palette).type = '\0';
  sVar9 = sptr_advance(sVar9,(ulong)*pbVar5);
  if (pbVar5[1] != 0) {
    colors = sptr_xmalloc(size);
    memcpy(colors.ptr,sVar9.ptr,size);
    uVar2 = 0xff;
    if ((pbVar5[8] == 0x18) && ((int)size == 0x300)) {
      flip_bgr(colors);
      uVar2 = '\x01';
    }
    (piVar6->palette).data = colors;
    (piVar6->palette).type = uVar2;
  }
  sVar9 = sptr_advance(sVar9,size);
  __src_00 = sVar9.ptr;
  (piVar6->pixels).ptr = (uchar *)0x0;
  (piVar6->pixels).size = 0;
  if (pbVar5[2] == 9) {
    if (pbVar5[0x12] == 8) {
      sVar9 = sptr_xmalloc((ulong)(piVar6->height * piVar6->width));
      pbVar5 = sVar9.ptr;
      piVar6->pixels = sVar9;
      if (sVar9.size != 0) {
        uVar7 = 0;
        do {
          __n = (ulong)(*__src_00 & 0x7f) + 1;
          __src = __src_00 + 1;
          iVar8 = (int)__n;
          if ((char)*__src_00 < '\0') {
            do {
              *pbVar5 = *__src;
              pbVar5 = pbVar5 + 1;
              uVar4 = (int)__n - 1;
              __n = (ulong)uVar4;
            } while (uVar4 != 0);
            __src_00 = __src_00 + 2;
          }
          else {
            memcpy(pbVar5,__src,__n);
            pbVar5 = pbVar5 + __n;
            __src_00 = __src + __n;
          }
          uVar7 = (ulong)(uint)((int)uVar7 + iVar8);
        } while (uVar7 < (piVar6->pixels).size);
      }
    }
  }
  else if ((pbVar5[2] == 1) && (pbVar5[0x12] == 8)) {
    sVar9 = sptr_xmalloc((ulong)(piVar6->height * piVar6->width));
    piVar6->pixels = sVar9;
    memcpy(sVar9.ptr,__src_00,sVar9.size);
  }
  return piVar6;
}

Assistant:

struct image_data *tga_read(const sptr_t data)
{
	struct tga_header *header = xmalloc(sizeof(struct tga_header));
	sptr_t content = tga_read_header(data, header);
	sptr_t palette;
	size_t cm_size = 0;
	struct image_data *im = xmalloc(sizeof(struct image_data));
	if (header->color_map_type > 0) {
		cm_size = (header->cm_entry_count * header->cm_entry_size) / 8;
	}
	im->header = header;
	im->type = IMAGE_TYPE_TGA;
	im->width = header->im_width;
	im->height = header->im_height;
	im->palette = (struct image_palette){SPTR_NULL, PALETTE_TYPE_NONE};
	// skip image ID
	content = sptr_advance(content, header->id_length);
	// color map
	if (header->color_map_type > 0) {
		palette = sptr_xmalloc(cm_size);
		memcpy(palette.ptr, content.ptr, cm_size);
		if (header->cm_entry_size == 24 && cm_size == 3 * 256) {
			flip_bgr(palette);
			im->palette = (struct image_palette){palette, PALETTE_TYPE_RGB_256};
		} else {
			im->palette = (struct image_palette){palette, PALETTE_TYPE_UNKNOWN};
		}
	}
	content = sptr_advance(content, cm_size);
	// pixels
	im->pixels = SPTR_NULL;
	if ((header->image_type == TGA_IMAGE_TYPE_UNCOMPRESSED_COLOR_MAPPED) &&
		(header->im_pixel_depth == 8)) {
		im->pixels = sptr_xmalloc(im->width * im->height);
		memcpy(im->pixels.ptr, content.ptr, im->pixels.size);
	} else if ((header->image_type == TGA_IMAGE_TYPE_RLE_COLOR_MAPPED) &&
			   (header->im_pixel_depth == 8)) {
		tga_read_rle_indexed(im, content);
	}
	return im;
}